

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

void update_monster_region(monst *mon)

{
  ushort uVar1;
  region *reg;
  uint *puVar2;
  bool bVar3;
  boolean bVar4;
  level *plVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  plVar5 = mon->dlevel;
  if (0 < plVar5->n_regions) {
    lVar9 = 0;
    do {
      reg = plVar5->regions[lVar9];
      bVar4 = inside_region(reg,(int)mon->mx,(int)mon->my);
      uVar1 = reg->n_monst;
      uVar6 = (ulong)uVar1;
      if (bVar4 == '\0') {
        if ((short)uVar1 < 1) {
          bVar3 = true;
        }
        else {
          lVar8 = 0;
          do {
            bVar10 = reg->monsters[lVar8] == mon->m_id;
            bVar3 = !bVar10;
            if (bVar10) break;
            bVar10 = uVar6 - 1 != lVar8;
            lVar8 = lVar8 + 1;
          } while (bVar10);
        }
        if ((0 < (short)uVar1) && (!bVar3)) {
          puVar2 = reg->monsters;
          uVar7 = 0;
          do {
            if (puVar2[uVar7] == mon->m_id) {
              reg->n_monst = uVar1 - 1;
              puVar2[uVar7] = puVar2[(long)(short)uVar1 + -1];
              break;
            }
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
      }
      else {
        if (0 < (short)uVar1) {
          uVar7 = 0;
          do {
            if (reg->monsters[uVar7] == mon->m_id) goto LAB_00231ded;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        add_mon_to_reg(reg,mon);
      }
LAB_00231ded:
      lVar9 = lVar9 + 1;
      plVar5 = mon->dlevel;
    } while (lVar9 < plVar5->n_regions);
  }
  return;
}

Assistant:

void update_monster_region(struct monst *mon)
{
    int i;

    for (i = 0; i < mon->dlevel->n_regions; i++) {
	if (inside_region(mon->dlevel->regions[i], mon->mx, mon->my)) {
	    if (!mon_in_region(mon->dlevel->regions[i], mon))
		add_mon_to_reg(mon->dlevel->regions[i], mon);
	} else {
	    if (mon_in_region(mon->dlevel->regions[i], mon))
		remove_mon_from_reg(mon->dlevel->regions[i], mon);
	}
    }
}